

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O0

bool __thiscall
cmParseJacocoCoverage::XMLParser::PackagePathFound(XMLParser *this,string *fileName,string *baseDir)

{
  cmCTest *this_00;
  string_view suffix;
  string_view str;
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  ostream *poVar2;
  char *msg;
  string local_2c0 [32];
  undefined1 local_2a0 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_108 [8];
  string dir;
  string *f;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files;
  undefined1 local_a8 [8];
  Glob gl;
  undefined1 local_48 [8];
  string packageGlob;
  string *baseDir_local;
  string *fileName_local;
  XMLParser *this_local;
  
  gl._87_1_ = 0x2f;
  packageGlob.field_2._8_8_ = baseDir;
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
            ((string *)local_48,baseDir,&gl.field_0x57,fileName);
  cmsys::Glob::Glob((Glob *)local_a8);
  cmsys::Glob::RecurseOn((Glob *)local_a8);
  cmsys::Glob::RecurseThroughSymlinksOn((Glob *)local_a8);
  cmsys::Glob::FindFiles((Glob *)local_a8,(string *)local_48,(GlobMessages *)0x0);
  this_01 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_a8);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(this_01);
  if (bVar1) {
    this_local._7_1_ = 0;
  }
  else {
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(this_01);
    f = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&f), bVar1) {
      dir.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end1);
      cmsys::SystemTools::GetParentDirectory((string *)local_108,(string *)dir.field_2._8_8_);
      str = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_108);
      suffix = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)&this->PackageName);
      bVar1 = cmHasSuffix(str,suffix);
      if (bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2a0);
        poVar2 = std::operator<<((ostream *)local_2a0,"Found package directory for ");
        poVar2 = std::operator<<(poVar2,(string *)fileName);
        poVar2 = std::operator<<(poVar2,": ");
        poVar2 = std::operator<<(poVar2,(string *)local_108);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        this_00 = this->CTest;
        std::__cxx11::ostringstream::str();
        msg = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(this_00,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
                     ,0x7d,msg,(bool)(this->Coverage->Quiet & 1));
        std::__cxx11::string::~string(local_2c0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2a0);
        std::__cxx11::string::operator=((string *)&this->PackagePath,(string *)local_108);
        this_local._7_1_ = 1;
      }
      std::__cxx11::string::~string((string *)local_108);
      if (bVar1) goto LAB_00268925;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = 0;
  }
LAB_00268925:
  cmsys::Glob::~Glob((Glob *)local_a8);
  std::__cxx11::string::~string((string *)local_48);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

virtual bool PackagePathFound(std::string const& fileName,
                                std::string const& baseDir)
  {
    // Search for the file in the baseDir and its subdirectories.
    std::string packageGlob = cmStrCat(baseDir, '/', fileName);
    cmsys::Glob gl;
    gl.RecurseOn();
    gl.RecurseThroughSymlinksOn();
    gl.FindFiles(packageGlob);
    std::vector<std::string> const& files = gl.GetFiles();
    if (files.empty()) {
      return false;
    }

    // Check if any of the locations found match our package.
    for (std::string const& f : files) {
      std::string dir = cmsys::SystemTools::GetParentDirectory(f);
      if (cmHasSuffix(dir, this->PackageName)) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "Found package directory for " << fileName << ": "
                                                          << dir << std::endl,
                           this->Coverage.Quiet);
        this->PackagePath = dir;
        return true;
      }
    }
    return false;
  }